

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O2

void __thiscall
UnitTests::Assert::
RangeEquals<std::__cxx11::list<long,std::allocator<long>>&,std::vector<int,std::allocator<int>>&>
          (Assert *this,list<long,_std::allocator<long>_> *expected,
          vector<int,_std::allocator<int>_> *got)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  RangeEquals<std::_List_iterator<long>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (this,&local_28,
             (expected->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
             super__List_node_base._M_next,(_List_iterator<long>)expected,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (got->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      (got->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void RangeEquals(ExpectedRange&& expected, GotRange&& got) const
        {
            RangeEquals(std::string(), begin(expected), end(expected), begin(got), end(got));
        }